

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLengthen.cpp
# Opt level: O2

int CmdLengthen(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  int *piVar1;
  CLI *this;
  bool verbose;
  bool bVar2;
  iterator __begin3;
  pointer pIVar3;
  _Base_ptr p_Var4;
  time_t delta;
  ostream *poVar5;
  string *psVar6;
  string *this_00;
  pointer interval;
  iterator __end3;
  allocator<char> local_159;
  CLI *local_158;
  string local_150;
  Journal *local_130;
  Rules *local_128;
  vector<Interval,_std::allocator<Interval>_> intervals;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  IntervalFilterAllWithIds filtering;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_88;
  Duration dur;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filtering,"verbose",(allocator<char> *)&ids);
  local_158 = cli;
  verbose = Rules::getBoolean(rules,(string *)&filtering,false);
  std::__cxx11::string::~string((string *)&filtering);
  this = local_158;
  CLI::getIds(&ids,local_158);
  if (ids._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"IDs must be specified. See \'timew help lengthen\'.",
               (allocator<char> *)&filtering);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  CLI::getDuration(&dur,this);
  Journal::startTransaction(journal);
  flattenDatabase(database,rules);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_88,&ids._M_t);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            (&filtering,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_88);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_88);
  local_128 = rules;
  getTracked(&intervals,database,rules,&filtering.super_IntervalFilter);
  interval = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (((long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
            super__Vector_impl_data._M_start) / 0xc0 !=
      ids._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    local_130 = journal;
    for (p_Var4 = ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pIVar3 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                 super__Vector_impl_data._M_start, journal = local_130,
        (_Rb_tree_header *)p_Var4 != &ids._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      do {
        if (pIVar3 == intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          psVar6 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"ID \'@{1}\' does not correspond to any tracking.",
                     &local_159);
          format<int>(psVar6,&local_150,p_Var4[1]._M_color);
          __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        piVar1 = &pIVar3->id;
        pIVar3 = pIVar3 + 1;
      } while (*piVar1 != p_Var4[1]._M_color);
    }
  }
  while( true ) {
    if (interval ==
        intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Journal::endTransaction(journal);
      std::vector<Interval,_std::allocator<Interval>_>::~vector(&intervals);
      IntervalFilterAllWithIds::~IntervalFilterAllWithIds(&filtering);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&ids._M_t);
      return 0;
    }
    bVar2 = Range::is_open(&interval->super_Range);
    if (bVar2) break;
    Database::deleteInterval(database,interval);
    delta = Duration::toTime_t(&dur);
    Datetime::operator+=(&(interval->super_Range).end,delta);
    validate(local_158,local_128,database,interval);
    Database::addInterval(database,interval,verbose);
    if (verbose) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Lengthened @");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,interval->id);
      poVar5 = std::operator<<(poVar5," by ");
      Duration::formatHours_abi_cxx11_(&local_150,&dur);
      poVar5 = std::operator<<(poVar5,(string *)&local_150);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_150);
    }
    interval = interval + 1;
  }
  psVar6 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Cannot lengthen open interval @{1}",&local_159);
  format<int>(psVar6,&local_150,interval->id);
  __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int CmdLengthen (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  auto ids = cli.getIds ();

  if (ids.empty ())
  {
    throw std::string ("IDs must be specified. See 'timew help lengthen'.");
  }

  auto dur = cli.getDuration ();

  journal.startTransaction ();

  flattenDatabase (database, rules);
  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  // Lengthen intervals specified by ids
  for (auto& interval : intervals)
  {
    if (interval.is_open ())
    {
      throw format ("Cannot lengthen open interval @{1}", interval.id);
    }

    database.deleteInterval (interval);

    interval.end += dur.toTime_t ();
    validate (cli, rules, database, interval);
    database.addInterval (interval, verbose);

    if (verbose)
    {
      std::cout << "Lengthened @" << interval.id << " by " << dur.formatHours () << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}